

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

String * __thiscall
kj::PathPtr::toWin32StringImpl
          (String *__return_storage_ptr__,PathPtr *this,bool absolute,bool forApi)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  String *pSVar5;
  char *pcVar6;
  char *__src;
  unsigned_long *puVar7;
  char (*extraout_RDX) [3];
  char (*extraout_RDX_00) [3];
  char (*params) [3];
  ArrayPtr<const_char> AVar8;
  Range<unsigned_long> RVar9;
  ArrayPtr<const_char> part;
  ArrayPtr<const_kj::String> *local_188;
  Fault local_168;
  Fault f_4;
  size_t i_1;
  Iterator __end1_2;
  Iterator __begin1_2;
  Range<unsigned_long> *__range1_2;
  Fault f_3;
  char **local_120;
  undefined1 local_118 [8];
  DebugComparison<char_*&,_char_*> _kjCondition_2;
  ulong local_e8;
  size_t i;
  Fault f_2;
  bool local_c2;
  DebugExpression<bool> local_c1;
  String *pSStack_c0;
  DebugExpression<bool> _kjCondition_1;
  String *p_1;
  String *__end1_1;
  String *__begin1_1;
  ArrayPtr<const_kj::String> *__range1_1;
  char *pcStack_98;
  bool leadingSlash;
  char *ptr;
  String *local_88;
  String *p;
  String *__end1;
  String *__begin1;
  ArrayPtr<const_kj::String> *__range1;
  size_t size;
  Fault f_1;
  Path *local_48;
  bool isUncPath;
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  bool forApi_local;
  bool absolute_local;
  PathPtr *this_local;
  String *result;
  
  f.exception._6_1_ = forApi;
  f.exception._7_1_ = absolute;
  sVar4 = ArrayPtr<const_kj::String>::size(&this->parts);
  if (sVar4 == 0) {
    f.exception._4_1_ = (f.exception._7_1_ ^ 0xff) & 1;
    f.exception._5_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)((long)&f.exception + 5));
    params = extraout_RDX;
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                (&local_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,200,FAILED,"!absolute","_kjCondition,\"absolute path is missing disk designator\""
                 ,(DebugExpression<bool> *)((long)&f.exception + 5),
                 (char (*) [41])"absolute path is missing disk designator");
      kj::_::Debug::Fault::~Fault(&local_28);
      params = extraout_RDX_00;
    }
    if ((f.exception._7_1_ & 1) == 0) {
      str<char_const(&)[2]>(__return_storage_ptr__,(kj *)0xa7f394,(char (*) [2])params);
    }
    else {
      str<char_const(&)[3]>(__return_storage_ptr__,(kj *)"\\\\",params);
    }
  }
  else {
    bVar1 = false;
    if ((f.exception._7_1_ & 1) == 0) {
      f.exception._6_1_ = 0;
    }
    else {
      pSVar5 = ArrayPtr<const_kj::String>::operator[](&this->parts,0);
      AVar8 = String::operator_cast_to_ArrayPtr(pSVar5);
      local_48 = (Path *)AVar8.ptr;
      AVar8.ptr = AVar8.size_;
      bVar2 = Path::isWin32Drive(local_48,AVar8);
      if (!bVar2) {
        pSVar5 = ArrayPtr<const_kj::String>::operator[](&this->parts,0);
        _f_1 = String::operator_cast_to_ArrayPtr(pSVar5);
        part.size_ = (char *)f_1._8_8_;
        part.ptr = part.size_;
        bVar1 = Path::isNetbiosName((Path *)f_1.exception,part);
        if (!bVar1) {
          pSVar5 = ArrayPtr<const_kj::String>::operator[](&this->parts,0);
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70],kj::String_const&>
                    ((Fault *)&size,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0xd6,FAILED,(char *)0x0,
                     "\"absolute win32 path must start with drive letter or netbios host name\", parts[0]"
                     ,(char (*) [70])
                      "absolute win32 path must start with drive letter or netbios host name",pSVar5
                    );
          kj::_::Debug::Fault::fatal((Fault *)&size);
        }
        bVar1 = true;
      }
    }
    if ((f.exception._6_1_ & 1) == 0) {
      iVar3 = 0;
      if (bVar1) {
        iVar3 = 2;
      }
      sVar4 = ArrayPtr<const_kj::String>::size(&this->parts);
      local_188 = (ArrayPtr<const_kj::String> *)((long)iVar3 + (sVar4 - 1));
    }
    else {
      iVar3 = 4;
      if (bVar1) {
        iVar3 = 8;
      }
      sVar4 = ArrayPtr<const_kj::String>::size(&this->parts);
      local_188 = (ArrayPtr<const_kj::String> *)((long)iVar3 + (sVar4 - 1));
    }
    __range1 = local_188;
    __begin1 = (String *)this;
    __end1 = ArrayPtr<const_kj::String>::begin(&this->parts);
    p = ArrayPtr<const_kj::String>::end((ArrayPtr<const_kj::String> *)__begin1);
    for (; __end1 != p; __end1 = __end1 + 1) {
      local_88 = __end1;
      sVar4 = String::size(__end1);
      __range1 = (ArrayPtr<const_kj::String> *)((long)&__range1->ptr + sVar4);
    }
    ptr._7_1_ = 0;
    heapString(__return_storage_ptr__,(size_t)__range1);
    pcVar6 = String::begin(__return_storage_ptr__);
    if ((f.exception._6_1_ & 1) == 0) {
      pcStack_98 = pcVar6;
      if (bVar1) {
        *pcVar6 = '\\';
        pcStack_98 = pcVar6 + 2;
        pcVar6[1] = '\\';
      }
    }
    else {
      builtin_strncpy(pcVar6,"\\\\?\\",4);
      pcStack_98 = pcVar6 + 4;
      if (bVar1) {
        builtin_strncpy(pcVar6 + 4,"UNC\\",4);
        pcStack_98 = pcVar6 + 8;
      }
    }
    bVar1 = false;
    __end1_1 = ArrayPtr<const_kj::String>::begin(&this->parts);
    pSVar5 = ArrayPtr<const_kj::String>::end(&this->parts);
    for (; __end1_1 != pSVar5; __end1_1 = __end1_1 + 1) {
      pSStack_c0 = __end1_1;
      if (bVar1) {
        *pcStack_98 = '\\';
        pcStack_98 = pcStack_98 + 1;
      }
      bVar1 = true;
      StringPtr::StringPtr((StringPtr *)&f_2,__end1_1);
      bVar2 = Path::isWin32Special((StringPtr)_f_2);
      local_c2 = (bool)(~bVar2 & 1);
      local_c1 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c2);
      bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_c1);
      pcVar6 = pcStack_98;
      if (bVar2) {
        __src = String::begin(pSStack_c0);
        sVar4 = String::size(pSStack_c0);
        memcpy(pcVar6,__src,sVar4);
        sVar4 = String::size(pSStack_c0);
        pcStack_98 = pcStack_98 + sVar4;
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[38],kj::String_const&>
                  ((Fault *)&i,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0xfd,FAILED,"!Path::isWin32Special(p)",
                   "_kjCondition,\"path cannot contain DOS reserved name\", p",&local_c1,
                   (char (*) [38])"path cannot contain DOS reserved name",pSStack_c0);
        for (local_e8 = 0; sVar4 = String::size(pSStack_c0), local_e8 < sVar4;
            local_e8 = local_e8 + 1) {
          *pcStack_98 = '|';
          pcStack_98 = pcStack_98 + 1;
        }
        _kjCondition_2._36_4_ = 0x12;
        kj::_::Debug::Fault::~Fault((Fault *)&i);
        if (_kjCondition_2._36_4_ != 0x12) goto LAB_009846e4;
      }
    }
    local_120 = (char **)kj::_::DebugExpressionStart::operator<<
                                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                    &stack0xffffffffffffff68);
    f_3.exception = (Exception *)String::end(__return_storage_ptr__);
    kj::_::DebugExpression<char*&>::operator==
              ((DebugComparison<char_*&,_char_*> *)local_118,(DebugExpression<char*&> *)&local_120,
               (char **)&f_3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_118);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
                ((Fault *)&__range1_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x10a,FAILED,"ptr == result.end()","_kjCondition,",
                 (DebugComparison<char_*&,_char_*> *)local_118);
      kj::_::Debug::Fault::fatal((Fault *)&__range1_2);
    }
    RVar9 = indices<kj::String&>(__return_storage_ptr__);
    __begin1_2.value = RVar9.begin_;
    __end1_2 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1_2);
    i_1 = (size_t)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1_2);
    while (bVar1 = Range<unsigned_long>::Iterator::operator==(&__end1_2,(Iterator *)&i_1),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar7 = Range<unsigned_long>::Iterator::operator*(&__end1_2);
      f_4.exception = (Exception *)*puVar7;
      pcVar6 = String::operator[](__return_storage_ptr__,(size_t)f_4.exception);
      if (*pcVar6 == ':') {
        if ((f.exception._7_1_ & 1) != 0) {
          iVar3 = 1;
          if ((f.exception._6_1_ & 1) != 0) {
            iVar3 = 5;
          }
          if (f_4.exception == (Exception *)(long)iVar3) goto LAB_009846be;
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[80],kj::String&>
                  (&local_168,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x117,FAILED,(char *)0x0,
                   "\"colons are prohibited in win32 paths to avoid triggering alternate data streams\", result"
                   ,(char (*) [80])
                    "colons are prohibited in win32 paths to avoid triggering alternate data streams"
                   ,__return_storage_ptr__);
        pcVar6 = String::operator[](__return_storage_ptr__,(size_t)f_4.exception);
        *pcVar6 = '|';
        _kjCondition_2._36_4_ = 0x18;
        kj::_::Debug::Fault::~Fault(&local_168);
      }
LAB_009846be:
      Range<unsigned_long>::Iterator::operator++(&__end1_2);
    }
    ptr._7_1_ = 1;
    _kjCondition_2._36_4_ = 1;
LAB_009846e4:
    if ((ptr._7_1_ & 1) == 0) {
      String::~String(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String PathPtr::toWin32StringImpl(bool absolute, bool forApi) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    KJ_REQUIRE(!absolute, "absolute path is missing disk designator") {
      break;
    }
    return absolute ? kj::str("\\\\") : kj::str(".");
  }

  bool isUncPath = false;
  if (absolute) {
    if (Path::isWin32Drive(parts[0])) {
      // It's a win32 drive
    } else if (Path::isNetbiosName(parts[0])) {
      isUncPath = true;
    } else {
      KJ_FAIL_REQUIRE("absolute win32 path must start with drive letter or netbios host name",
                      parts[0]);
    }
  } else {
    // Currently we do nothing differently in the forApi case for relative paths.
    forApi = false;
  }

  size_t size = forApi
      ? (isUncPath ? 8 : 4) + (parts.size() - 1)
      : (isUncPath ? 2 : 0) + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = heapString(size);

  char* ptr = result.begin();

  if (forApi) {
    *ptr++ = '\\';
    *ptr++ = '\\';
    *ptr++ = '?';
    *ptr++ = '\\';
    if (isUncPath) {
      *ptr++ = 'U';
      *ptr++ = 'N';
      *ptr++ = 'C';
      *ptr++ = '\\';
    }
  } else {
    if (isUncPath) {
      *ptr++ = '\\';
      *ptr++ = '\\';
    }
  }

  bool leadingSlash = false;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '\\';
    leadingSlash = true;

    KJ_REQUIRE(!Path::isWin32Special(p), "path cannot contain DOS reserved name", p) {
      // Recover by blotting out the name with invalid characters which Win32 syscalls will reject.
      for (size_t i = 0; i < p.size(); i++) {
        *ptr++ = '|';
      }
      goto skip;
    }

    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  skip:;
  }

  KJ_ASSERT(ptr == result.end());

  // Check for colons (other than in drive letter), which on NTFS would be interpreted as an
  // "alternate data stream", which can lead to surprising results. If we want to support ADS, we
  // should do so using an explicit API. Note that this check also prevents a relative path from
  // appearing to start with a drive letter.
  for (size_t i: kj::indices(result)) {
    if (result[i] == ':') {
      if (absolute && i == (forApi ? 5 : 1)) {
        // False alarm: this is the drive letter.
      } else {
        KJ_FAIL_REQUIRE(
            "colons are prohibited in win32 paths to avoid triggering alternate data streams",
            result) {
          // Recover by using a different character which we know Win32 syscalls will reject.
          result[i] = '|';
          break;
        }
      }
    }
  }

  return result;
}